

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMemory.cpp
# Opt level: O3

int adios2::helper::NdCopy
              (char *in,CoreDims *inStart,CoreDims *inCount,bool inIsRowMajor,bool inIsLittleEndian,
              char *out,CoreDims *outStart,CoreDims *outCount,bool outIsRowMajor,
              bool outIsLittleEndian,int typeSize,CoreDims *inMemStart,CoreDims *inMemCount,
              CoreDims *outMemStart,CoreDims *outMemCount,bool safeMode,MemorySpace MemSpace,
              bool duringWrite)

{
  size_t *psVar1;
  byte bVar2;
  size_t *psVar3;
  size_t *psVar4;
  CoreDims *pCVar5;
  ulong uVar6;
  size_t *psVar7;
  size_t **ppsVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  undefined7 in_register_00000009;
  size_t *psVar12;
  CoreDims *pCVar13;
  size_t sVar14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  char *__dest;
  CoreDims *pCVar18;
  ulong uVar19;
  undefined7 in_register_00000081;
  size_t *psVar20;
  char *pcVar21;
  char *__src;
  size_t *psVar22;
  ulong uVar23;
  size_t *psVar24;
  size_t *psVar25;
  size_t sVar26;
  size_t sVar27;
  allocator_type local_1399;
  CoreDims *local_1398;
  CoreDims *local_1390;
  size_t local_1388;
  size_t local_1380;
  char *local_1378;
  char *local_1370;
  undefined4 local_1364;
  size_t local_1360;
  size_t local_1358;
  DimsArray inStride;
  DimsArray outStride;
  DimsArray revInStart;
  DimsArray revOvlpStart;
  DimsArray ovlpCount;
  size_t blockSize;
  char **local_df8;
  char *local_df0 [32];
  DimsArray ovlpStart;
  DimsArray ovlpEnd;
  DimsArray outMemCountNC;
  DimsArray inMemCountNC;
  DimsArray outEnd;
  DimsArray inEnd;
  DimsArray outRltvOvlpStartPos;
  DimsArray inRltvOvlpStartPos;
  DimsArray outMemStartNC;
  DimsArray inMemStartNC;
  DimsArray outOvlpGapSize;
  DimsArray inOvlpGapSize;
  
  local_1364 = (undefined4)CONCAT71(in_register_00000081,inIsLittleEndian);
  local_1380 = CONCAT44(local_1380._4_4_,(int)CONCAT71(in_register_00000009,inIsRowMajor));
  if (inMemStart->DimCount == 0) {
    inMemStart = inStart;
  }
  sVar11 = inMemStart->DimCount;
  psVar20 = inMemStartNC.Dimensions;
  local_1398 = inStart;
  local_1390 = inCount;
  inMemStartNC.super_CoreDims.DimCount = sVar11;
  inMemStartNC.super_CoreDims.DimensSpan = psVar20;
  memset(psVar20,0,0x100);
  if (sVar11 != 0) {
    memmove(psVar20,inMemStart->DimensSpan,sVar11 * 8);
  }
  if (inMemCount->DimCount == 0) {
    inMemCount = local_1390;
  }
  sVar10 = inMemCount->DimCount;
  psVar20 = inMemCountNC.Dimensions;
  local_1360 = sVar11;
  inMemCountNC.super_CoreDims.DimCount = sVar10;
  inMemCountNC.super_CoreDims.DimensSpan = psVar20;
  memset(psVar20,0,0x100);
  if (sVar10 != 0) {
    memmove(psVar20,inMemCount->DimensSpan,sVar10 * 8);
  }
  if (outMemStart->DimCount == 0) {
    outMemStart = outStart;
  }
  sVar11 = outMemStart->DimCount;
  psVar20 = outMemStartNC.Dimensions;
  local_1358 = sVar10;
  outMemStartNC.super_CoreDims.DimCount = sVar11;
  outMemStartNC.super_CoreDims.DimensSpan = psVar20;
  memset(psVar20,0,0x100);
  if (sVar11 != 0) {
    memmove(psVar20,outMemStart->DimensSpan,sVar11 * 8);
  }
  if (outMemCount->DimCount == 0) {
    outMemCount = outCount;
  }
  sVar10 = outMemCount->DimCount;
  psVar20 = outMemCountNC.Dimensions;
  local_1388 = sVar11;
  outMemCountNC.super_CoreDims.DimCount = sVar10;
  outMemCountNC.super_CoreDims.DimensSpan = psVar20;
  memset(psVar20,0,0x100);
  if (sVar10 != 0) {
    memmove(psVar20,outMemCount->DimensSpan,sVar10 * 8);
  }
  uVar15 = local_1398->DimCount;
  inEnd.super_CoreDims.DimensSpan = inEnd.Dimensions;
  inEnd.super_CoreDims.DimCount = uVar15;
  memset(inEnd.super_CoreDims.DimensSpan,0,0x100);
  outEnd.super_CoreDims.DimensSpan = outEnd.Dimensions;
  outEnd.super_CoreDims.DimCount = uVar15;
  memset(outEnd.super_CoreDims.DimensSpan,0,0x100);
  ovlpStart.super_CoreDims.DimensSpan = ovlpStart.Dimensions;
  ovlpStart.super_CoreDims.DimCount = uVar15;
  memset(ovlpStart.super_CoreDims.DimensSpan,0,0x100);
  psVar20 = ovlpEnd.Dimensions;
  ovlpEnd.super_CoreDims.DimCount = uVar15;
  ovlpEnd.super_CoreDims.DimensSpan = psVar20;
  memset(psVar20,0,0x100);
  ovlpCount.super_CoreDims.DimensSpan = ovlpCount.Dimensions;
  ovlpCount.super_CoreDims.DimCount = uVar15;
  memset(ovlpCount.super_CoreDims.DimensSpan,0,0x100);
  inStride.super_CoreDims.DimensSpan = inStride.Dimensions;
  inStride.super_CoreDims.DimCount = uVar15;
  memset(inStride.super_CoreDims.DimensSpan,0,0x100);
  outStride.super_CoreDims.DimensSpan = outStride.Dimensions;
  outStride.super_CoreDims.DimCount = uVar15;
  memset(outStride.super_CoreDims.DimensSpan,0,0x100);
  inOvlpGapSize.super_CoreDims.DimensSpan = inOvlpGapSize.Dimensions;
  inOvlpGapSize.super_CoreDims.DimCount = uVar15;
  memset(inOvlpGapSize.super_CoreDims.DimensSpan,0,0x100);
  outOvlpGapSize.super_CoreDims.DimensSpan = outOvlpGapSize.Dimensions;
  outOvlpGapSize.super_CoreDims.DimCount = uVar15;
  memset(outOvlpGapSize.super_CoreDims.DimensSpan,0,0x100);
  inRltvOvlpStartPos.super_CoreDims.DimensSpan = inRltvOvlpStartPos.Dimensions;
  inRltvOvlpStartPos.super_CoreDims.DimCount = uVar15;
  memset(inRltvOvlpStartPos.super_CoreDims.DimensSpan,0,0x100);
  outRltvOvlpStartPos.super_CoreDims.DimensSpan = outRltvOvlpStartPos.Dimensions;
  sVar27 = 0x3f78eb;
  outRltvOvlpStartPos.super_CoreDims.DimCount = uVar15;
  memset(outRltvOvlpStartPos.super_CoreDims.DimensSpan,0,0x100);
  psVar7 = ovlpStart.super_CoreDims.DimensSpan;
  sVar11 = ovlpStart.super_CoreDims.DimCount;
  pCVar5 = local_1390;
  local_1370 = (char *)0x0;
  local_1378 = (char *)0x0;
  bVar2 = (byte)local_1380;
  if ((bVar2 ^ 1) == 0 && outIsRowMajor) {
    if (uVar15 != 0) {
      psVar12 = local_1390->DimensSpan;
      psVar25 = local_1398->DimensSpan;
      uVar6 = 0;
      do {
        inEnd.Dimensions[uVar6] = (psVar25[uVar6] + psVar12[uVar6]) - 1;
        uVar6 = uVar6 + 1;
      } while (uVar15 != uVar6);
    }
    sVar10 = outStart->DimCount;
    psVar12 = outStart->DimensSpan;
    if (sVar10 != 0) {
      psVar25 = outCount->DimensSpan;
      sVar14 = 0;
      do {
        outEnd.Dimensions[sVar14] = (psVar12[sVar14] + psVar25[sVar14]) - 1;
        sVar14 = sVar14 + 1;
      } while (sVar10 != sVar14);
    }
    if (uVar15 == 0) {
      sVar11 = 0;
    }
    else {
      psVar25 = local_1398->DimensSpan;
      uVar6 = 0;
      do {
        uVar19 = psVar12[uVar6];
        if (uVar19 < psVar25[uVar6]) {
          uVar19 = psVar25[uVar6];
        }
        ovlpStart.Dimensions[uVar6] = uVar19;
        psVar24 = inEnd.super_CoreDims.DimensSpan;
        psVar1 = outEnd.super_CoreDims.DimensSpan;
        psVar22 = ovlpEnd.super_CoreDims.DimensSpan;
        uVar6 = uVar6 + 1;
      } while (uVar6 < ovlpStart.super_CoreDims.DimCount);
      if (uVar15 != 0) {
        uVar6 = 0;
        do {
          uVar19 = psVar1[uVar6];
          if (psVar24[uVar6] < psVar1[uVar6]) {
            uVar19 = psVar24[uVar6];
          }
          ovlpEnd.Dimensions[uVar6] = uVar19;
          uVar6 = uVar6 + 1;
        } while (uVar6 < ovlpEnd.super_CoreDims.DimCount);
        psVar20 = ovlpEnd.super_CoreDims.DimensSpan;
        if (uVar15 != 0) {
          uVar19 = 0;
          do {
            ovlpCount.Dimensions[uVar19] = (psVar22[uVar19] - psVar7[uVar19]) + 1;
            uVar19 = uVar19 + 1;
            uVar6 = ovlpCount.super_CoreDims.DimCount;
          } while (uVar19 < ovlpCount.super_CoreDims.DimCount);
          goto LAB_003f7e0c;
        }
      }
    }
    uVar6 = 0;
    psVar22 = psVar20;
LAB_003f7e0c:
    if (sVar11 != 0) {
      if (*psVar22 < *psVar7) {
        return 1;
      }
      uVar19 = 1;
      do {
        uVar23 = uVar19;
        if (sVar11 == uVar23) break;
        uVar19 = uVar23 + 1;
      } while (psVar7[uVar23] <= psVar22[uVar23]);
      if (uVar23 < sVar11) {
        return 1;
      }
    }
    local_1398 = (CoreDims *)(long)typeSize;
    inStride.Dimensions[uVar15 - 1] = (size_t)local_1398;
    if ((1 < inStride.super_CoreDims.DimCount) &&
       (inStride.Dimensions[inStride.super_CoreDims.DimCount - 2] =
             inMemCountNC.Dimensions[inStride.super_CoreDims.DimCount - 1] * (long)local_1398,
       2 < inStride.super_CoreDims.DimCount)) {
      sVar11 = inStride.Dimensions[inStride.super_CoreDims.DimCount - 2];
      sVar10 = inStride.super_CoreDims.DimCount;
      do {
        sVar11 = sVar11 * inMemCountNC.Dimensions[sVar10 - 2];
        inStride.Dimensions[sVar10 - 3] = sVar11;
        sVar10 = sVar10 - 1;
      } while (sVar10 != 2);
    }
    outStride.Dimensions[uVar15 - 1] = (size_t)local_1398;
    if ((1 < outStride.super_CoreDims.DimCount) &&
       (outStride.Dimensions[outStride.super_CoreDims.DimCount - 2] =
             outMemCountNC.Dimensions[outStride.super_CoreDims.DimCount - 1] * (long)local_1398,
       2 < outStride.super_CoreDims.DimCount)) {
      sVar11 = outStride.Dimensions[outStride.super_CoreDims.DimCount - 2];
      sVar10 = outStride.super_CoreDims.DimCount;
      do {
        sVar11 = sVar11 * outMemCountNC.Dimensions[sVar10 - 2];
        outStride.Dimensions[sVar10 - 3] = sVar11;
        sVar10 = sVar10 - 1;
      } while (sVar10 != 2);
    }
    if (uVar15 != 0) {
      uVar19 = 0;
      do {
        inOvlpGapSize.Dimensions[uVar19] =
             (inMemCountNC.Dimensions[uVar19] - ovlpCount.super_CoreDims.DimensSpan[uVar19]) *
             inStride.super_CoreDims.DimensSpan[uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar19 < inOvlpGapSize.super_CoreDims.DimCount);
      if (uVar15 != 0) {
        uVar15 = 0;
        do {
          outOvlpGapSize.Dimensions[uVar15] =
               (outMemCountNC.Dimensions[uVar15] - ovlpCount.super_CoreDims.DimensSpan[uVar15]) *
               outStride.super_CoreDims.DimensSpan[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar15 < outOvlpGapSize.super_CoreDims.DimCount);
      }
    }
    local_1370 = in;
    if (local_1360 != 0) {
      uVar15 = 0;
      do {
        in = in + (psVar7[uVar15] - inMemStartNC.Dimensions[uVar15]) *
                  inStride.super_CoreDims.DimensSpan[uVar15];
        uVar15 = uVar15 + 1;
        local_1370 = in;
      } while (local_1360 != uVar15);
    }
    __src = local_1370;
    local_1378 = out;
    if (local_1388 != 0) {
      uVar15 = 0;
      do {
        out = out + (psVar7[uVar15] - outMemStartNC.Dimensions[uVar15]) *
                    outStride.super_CoreDims.DimensSpan[uVar15];
        uVar15 = uVar15 + 1;
        local_1378 = out;
      } while (local_1388 != uVar15);
    }
    __dest = local_1378;
    uVar15 = 0xffffffffffffffff;
    do {
      uVar19 = uVar15;
      if ((uVar6 + uVar19 == 0) ||
         (inMemCountNC.Dimensions[uVar6 + uVar19] !=
          ovlpCount.super_CoreDims.DimensSpan[uVar6 + uVar19])) break;
      uVar15 = uVar19 - 1;
    } while (outMemCountNC.Dimensions[uVar6 + uVar19] == inMemCountNC.Dimensions[uVar6 + uVar19]);
    psVar20 = (size_t *)(uVar6 + uVar19);
    uVar15 = uVar19;
    uVar23 = (ulong)local_1398;
    if (CARRY8(uVar6,uVar19)) {
      do {
        uVar23 = uVar23 * ovlpCount.super_CoreDims.DimensSpan[uVar6 + uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar15 != 0);
    }
    revInStart.super_CoreDims.DimCount = uVar6;
    blockSize = uVar23;
    if ((bool)(char)local_1364 != outIsLittleEndian) {
      if (!safeMode) {
        NdCopyRecurDFSeqPaddingRevEndian
                  (0,&local_1370,&local_1378,&inOvlpGapSize.super_CoreDims,
                   &outOvlpGapSize.super_CoreDims,&ovlpCount.super_CoreDims,(size_t)psVar20,
                   (size_t)local_1398,uVar23 / (ulong)local_1398,sVar27);
        return 0;
      }
      psVar7 = revInStart.Dimensions;
      local_1390 = (CoreDims *)psVar20;
      local_1380 = uVar23 / (ulong)local_1398;
      revInStart.super_CoreDims.DimensSpan = psVar7;
      memset(psVar7,0,0x100);
      if (uVar6 != 0) {
        memset(psVar7,0,uVar6 * 8);
      }
      psVar20 = (size_t *)0x0;
      do {
        for (; (size_t *)(uVar6 + uVar19) != psVar20; psVar20 = (size_t *)((long)psVar20 + 1)) {
          psVar7[(long)psVar20] = psVar7[(long)psVar20] + 1;
        }
        pCVar5 = local_1390;
        if (local_1398 <= uVar23) {
          uVar15 = 0;
          pcVar21 = __src;
          do {
            __src = pcVar21 + (long)local_1398;
            pcVar16 = __dest;
            pCVar18 = local_1398;
            do {
              *pcVar16 = (pcVar21 + -1)[(long)pCVar18];
              pcVar16 = pcVar16 + 1;
              pCVar18 = (CoreDims *)((long)pCVar18 - 1);
            } while (pCVar18 != (CoreDims *)0x0);
            __dest = __dest + (long)local_1398;
            uVar15 = uVar15 + 1;
            pcVar21 = __src;
          } while (uVar15 != local_1380);
        }
        do {
          psVar20 = (size_t *)((long)pCVar5 + -1);
          if (pCVar5 == (CoreDims *)0x0) {
            return 0;
          }
          __src = __src + inOvlpGapSize.super_CoreDims.DimensSpan[(long)pCVar5];
          __dest = __dest + outOvlpGapSize.super_CoreDims.DimensSpan[(long)pCVar5];
          revInStart.super_CoreDims.DimensSpan[(long)pCVar5] = 0;
          pCVar5 = (CoreDims *)psVar20;
          psVar7 = revInStart.super_CoreDims.DimensSpan;
        } while (revInStart.super_CoreDims.DimensSpan[(long)psVar20] ==
                 ovlpCount.super_CoreDims.DimensSpan[(long)psVar20]);
      } while( true );
    }
    if (!safeMode) {
      NdCopyRecurDFSeqPadding
                (0,&local_1370,&local_1378,&inOvlpGapSize.super_CoreDims,
                 &outOvlpGapSize.super_CoreDims,&ovlpCount.super_CoreDims,psVar20,&blockSize);
      return 0;
    }
    psVar7 = revInStart.Dimensions;
    local_1390 = (CoreDims *)psVar20;
    revInStart.super_CoreDims.DimensSpan = psVar7;
    memset(psVar7,0,0x100);
    if (uVar6 != 0) {
      memset(psVar7,0,uVar6 * 8);
    }
    psVar20 = (size_t *)0x0;
    do {
      for (; (size_t *)(uVar6 + uVar19) != psVar20; psVar20 = (size_t *)((long)psVar20 + 1)) {
        psVar7[(long)psVar20] = psVar7[(long)psVar20] + 1;
      }
      memcpy(__dest,__src,uVar23);
      __src = __src + uVar23;
      __dest = __dest + uVar23;
      pCVar5 = local_1390;
      do {
        psVar20 = (size_t *)((long)pCVar5 + -1);
        if (pCVar5 == (CoreDims *)0x0) {
          return 0;
        }
        __src = __src + inOvlpGapSize.super_CoreDims.DimensSpan[(long)pCVar5];
        __dest = __dest + outOvlpGapSize.super_CoreDims.DimensSpan[(long)pCVar5];
        revInStart.super_CoreDims.DimensSpan[(long)pCVar5] = 0;
        pCVar5 = (CoreDims *)psVar20;
        psVar7 = revInStart.super_CoreDims.DimensSpan;
      } while (revInStart.super_CoreDims.DimensSpan[(long)psVar20] ==
               ovlpCount.super_CoreDims.DimensSpan[(long)psVar20]);
    } while( true );
  }
  if (bVar2 != 0 || outIsRowMajor) {
    if ((bVar2 ^ 1) != 0 || outIsRowMajor) {
      if (!outIsRowMajor || bVar2 != 0) goto LAB_003f8a54;
      psVar7 = revInStart.Dimensions;
      revInStart.super_CoreDims.DimCount = uVar15;
      revInStart.super_CoreDims.DimensSpan = psVar7;
      memset(psVar7,0,0x100);
      if (uVar15 != 0) {
        memmove(psVar7,local_1398->DimensSpan,uVar15 * 8);
      }
      sVar11 = pCVar5->DimCount;
      local_df8 = local_df0;
      blockSize = sVar11;
      memset(local_df8,0,0x100);
      if (sVar11 != 0) {
        memmove(local_df0,pCVar5->DimensSpan,sVar11 << 3);
      }
      psVar7 = ovlpStart.super_CoreDims.DimensSpan;
      sVar11 = ovlpStart.super_CoreDims.DimCount;
      if (0x10 < (long)(local_1360 * 8 + 8)) {
        ppsVar8 = (size_t **)(inMemStartNC.Dimensions + (local_1360 - 1));
        psVar12 = inMemStartNC.Dimensions;
        do {
          psVar12 = psVar12 + 1;
          sVar10 = psVar12[-1];
          psVar12[-1] = (size_t)*ppsVar8;
          *ppsVar8 = (size_t *)sVar10;
          ppsVar8 = ppsVar8 + -1;
        } while (psVar12 < ppsVar8);
      }
      if (0x10 < (long)(local_1358 * 8 + 8)) {
        ppsVar8 = (size_t **)(inMemCountNC.Dimensions + (local_1358 - 1));
        psVar12 = inMemCountNC.Dimensions;
        do {
          psVar12 = psVar12 + 1;
          sVar10 = psVar12[-1];
          psVar12[-1] = (size_t)*ppsVar8;
          *ppsVar8 = (size_t *)sVar10;
          ppsVar8 = ppsVar8 + -1;
        } while (psVar12 < ppsVar8);
      }
      if (uVar15 != 0) {
        uVar6 = 0;
        do {
          inEnd.Dimensions[uVar6] = (size_t)(local_df0[uVar6] + (revInStart.Dimensions[uVar6] - 1));
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar15);
      }
      uVar6 = outStart->DimCount;
      psVar12 = outStart->DimensSpan;
      if (uVar6 != 0) {
        psVar25 = outCount->DimensSpan;
        uVar19 = 0;
        do {
          outEnd.Dimensions[uVar19] = (psVar12[uVar19] + psVar25[uVar19]) - 1;
          uVar19 = uVar19 + 1;
        } while (uVar19 < uVar6);
      }
      if (uVar15 == 0) {
        sVar11 = 0;
LAB_003f8847:
        uVar6 = 0;
        psVar25 = psVar20;
      }
      else {
        uVar6 = 0;
        do {
          uVar19 = psVar12[uVar6];
          if (uVar19 < revInStart.Dimensions[uVar6]) {
            uVar19 = revInStart.Dimensions[uVar6];
          }
          ovlpStart.Dimensions[uVar6] = uVar19;
          psVar1 = inEnd.super_CoreDims.DimensSpan;
          psVar22 = outEnd.super_CoreDims.DimensSpan;
          psVar25 = ovlpEnd.super_CoreDims.DimensSpan;
          uVar6 = uVar6 + 1;
        } while (uVar6 < ovlpStart.super_CoreDims.DimCount);
        if (uVar15 == 0) goto LAB_003f8847;
        uVar6 = 0;
        do {
          uVar19 = psVar22[uVar6];
          if (psVar1[uVar6] < psVar22[uVar6]) {
            uVar19 = psVar1[uVar6];
          }
          ovlpEnd.Dimensions[uVar6] = uVar19;
          uVar6 = uVar6 + 1;
        } while (uVar6 < ovlpEnd.super_CoreDims.DimCount);
        psVar20 = ovlpEnd.super_CoreDims.DimensSpan;
        if (uVar15 == 0) goto LAB_003f8847;
        uVar19 = 0;
        do {
          ovlpCount.Dimensions[uVar19] = (psVar25[uVar19] - psVar7[uVar19]) + 1;
          uVar19 = uVar19 + 1;
          uVar6 = ovlpCount.super_CoreDims.DimCount;
        } while (uVar19 < ovlpCount.super_CoreDims.DimCount);
      }
      if (sVar11 != 0) {
        if (*psVar25 < *psVar7) {
          return 1;
        }
        uVar19 = 1;
        do {
          uVar23 = uVar19;
          if (sVar11 == uVar23) break;
          uVar19 = uVar23 + 1;
        } while (psVar7[uVar23] <= psVar25[uVar23]);
        if (uVar23 < sVar11) {
          return 1;
        }
      }
      sVar10 = (size_t)typeSize;
      outStride.Dimensions[uVar15 - 1] = sVar10;
      if ((1 < outStride.super_CoreDims.DimCount) &&
         (outStride.Dimensions[outStride.super_CoreDims.DimCount - 2] =
               outMemCountNC.Dimensions[outStride.super_CoreDims.DimCount - 1] * sVar10,
         2 < outStride.super_CoreDims.DimCount)) {
        sVar27 = outStride.Dimensions[outStride.super_CoreDims.DimCount - 2];
        sVar14 = outStride.super_CoreDims.DimCount;
        do {
          sVar27 = sVar27 * outMemCountNC.Dimensions[sVar14 - 2];
          outStride.Dimensions[sVar14 - 3] = sVar27;
          sVar14 = sVar14 - 1;
        } while (sVar14 != 2);
      }
      psVar20 = inMemCountNC.super_CoreDims.DimensSpan;
      inStride.Dimensions[uVar15 - 1] = sVar10;
      if ((1 < inStride.super_CoreDims.DimCount) &&
         (inStride.Dimensions[inStride.super_CoreDims.DimCount - 2] =
               sVar10 * psVar20[inStride.super_CoreDims.DimCount - 1],
         2 < inStride.super_CoreDims.DimCount)) {
        sVar10 = inStride.Dimensions[inStride.super_CoreDims.DimCount - 2];
        sVar27 = inStride.super_CoreDims.DimCount;
        do {
          sVar10 = sVar10 * psVar20[sVar27 - 2];
          inStride.Dimensions[sVar27 - 3] = sVar10;
          sVar27 = sVar27 - 1;
        } while (sVar27 != 2);
      }
      ppsVar8 = (size_t **)(inStride.Dimensions + (inStride.super_CoreDims.DimCount - 1));
      if (inStride.Dimensions < ppsVar8 && inStride.super_CoreDims.DimCount != 0) {
        psVar20 = inStride.Dimensions;
        do {
          psVar20 = psVar20 + 1;
          sVar10 = psVar20[-1];
          psVar20[-1] = (size_t)*ppsVar8;
          *ppsVar8 = (size_t *)sVar10;
          ppsVar8 = ppsVar8 + -1;
        } while (psVar20 < ppsVar8);
      }
      psVar20 = revOvlpStart.Dimensions;
      revOvlpStart.super_CoreDims.DimCount = sVar11;
      revOvlpStart.super_CoreDims.DimensSpan = psVar20;
      memset(psVar20,0,0x100);
      if (sVar11 != 0) {
        memmove(psVar20,psVar7,sVar11 * 8);
        ppsVar8 = (size_t **)(revOvlpStart.Dimensions + (sVar11 - 1));
        if (psVar20 < ppsVar8) {
          psVar12 = revOvlpStart.Dimensions;
          do {
            psVar12 = psVar12 + 1;
            sVar11 = psVar12[-1];
            psVar12[-1] = (size_t)*ppsVar8;
            *ppsVar8 = (size_t *)sVar11;
            ppsVar8 = ppsVar8 + -1;
            psVar20 = revOvlpStart.super_CoreDims.DimensSpan;
          } while (psVar12 < ppsVar8);
        }
      }
      sVar11 = inMemStartNC.super_CoreDims.DimCount;
      if (inMemStartNC.super_CoreDims.DimCount != 0) {
        uVar15 = 0;
        do {
          inRltvOvlpStartPos.Dimensions[uVar15] = psVar20[uVar15] - inMemStartNC.Dimensions[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar15 < sVar11);
      }
      uVar15 = uVar6;
      if (local_1388 != 0) {
        uVar6 = 0;
        do {
          outRltvOvlpStartPos.Dimensions[uVar6] = psVar7[uVar6] - outMemStartNC.Dimensions[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar6 < local_1388);
      }
      goto LAB_003f8a54;
    }
    uVar6 = outStart->DimCount;
    revInStart.super_CoreDims.DimensSpan = revInStart.Dimensions;
    revInStart.super_CoreDims.DimCount = uVar6;
    memset(revInStart.super_CoreDims.DimensSpan,0,0x100);
    if (uVar6 != 0) {
      memmove(revInStart.Dimensions,outStart->DimensSpan,uVar6 * 8);
    }
    local_1380 = outCount->DimCount;
    local_df8 = local_df0;
    blockSize = local_1380;
    memset(local_df8,0,0x100);
    if (local_1380 != 0) {
      memmove(local_df0,outCount->DimensSpan,local_1380 << 3);
    }
    psVar7 = ovlpStart.super_CoreDims.DimensSpan;
    pCVar5 = (CoreDims *)ovlpStart.super_CoreDims.DimCount;
    if (0x10 < (long)(local_1388 * 8 + 8)) {
      ppsVar8 = (size_t **)(outMemStartNC.Dimensions + (local_1388 - 1));
      psVar12 = outMemStartNC.Dimensions;
      do {
        psVar12 = psVar12 + 1;
        sVar11 = psVar12[-1];
        psVar12[-1] = (size_t)*ppsVar8;
        *ppsVar8 = (size_t *)sVar11;
        ppsVar8 = ppsVar8 + -1;
      } while (psVar12 < ppsVar8);
    }
    if (0x10 < (long)(sVar10 * 8 + 8)) {
      ppsVar8 = (size_t **)(outMemCountNC.Dimensions + (sVar10 - 1));
      psVar12 = outMemCountNC.Dimensions;
      do {
        psVar12 = psVar12 + 1;
        sVar11 = psVar12[-1];
        psVar12[-1] = (size_t)*ppsVar8;
        *ppsVar8 = (size_t *)sVar11;
        ppsVar8 = ppsVar8 + -1;
      } while (psVar12 < ppsVar8);
    }
    if (uVar15 != 0) {
      psVar12 = local_1390->DimensSpan;
      psVar25 = local_1398->DimensSpan;
      uVar19 = 0;
      do {
        inEnd.Dimensions[uVar19] = (psVar25[uVar19] + psVar12[uVar19]) - 1;
        uVar19 = uVar19 + 1;
      } while (uVar19 < uVar15);
    }
    if (uVar6 != 0) {
      uVar19 = 0;
      do {
        outEnd.Dimensions[uVar19] =
             (size_t)(local_df0[uVar19] + (revInStart.Dimensions[uVar19] - 1));
        uVar19 = uVar19 + 1;
      } while (uVar19 < uVar6);
    }
    if (uVar15 == 0) {
      pCVar5 = (CoreDims *)0x0;
LAB_003f85f3:
      uVar6 = 0;
      psVar25 = psVar20;
    }
    else {
      psVar12 = local_1398->DimensSpan;
      uVar6 = 0;
      do {
        uVar19 = revInStart.Dimensions[uVar6];
        if (revInStart.Dimensions[uVar6] < psVar12[uVar6]) {
          uVar19 = psVar12[uVar6];
        }
        ovlpStart.Dimensions[uVar6] = uVar19;
        psVar1 = inEnd.super_CoreDims.DimensSpan;
        psVar22 = outEnd.super_CoreDims.DimensSpan;
        psVar25 = ovlpEnd.super_CoreDims.DimensSpan;
        uVar6 = uVar6 + 1;
      } while (uVar6 < ovlpStart.super_CoreDims.DimCount);
      if (uVar15 == 0) goto LAB_003f85f3;
      uVar6 = 0;
      do {
        uVar19 = psVar22[uVar6];
        if (psVar1[uVar6] < psVar22[uVar6]) {
          uVar19 = psVar1[uVar6];
        }
        ovlpEnd.Dimensions[uVar6] = uVar19;
        uVar6 = uVar6 + 1;
      } while (uVar6 < ovlpEnd.super_CoreDims.DimCount);
      psVar20 = ovlpEnd.super_CoreDims.DimensSpan;
      if (uVar15 == 0) goto LAB_003f85f3;
      uVar19 = 0;
      do {
        ovlpCount.Dimensions[uVar19] = (psVar25[uVar19] - psVar7[uVar19]) + 1;
        uVar19 = uVar19 + 1;
        uVar6 = ovlpCount.super_CoreDims.DimCount;
      } while (uVar19 < ovlpCount.super_CoreDims.DimCount);
    }
    if (pCVar5 == (CoreDims *)0x0) {
      local_1398 = (CoreDims *)0x0;
    }
    else {
      if (*psVar25 < *psVar7) {
        return 1;
      }
      pCVar18 = (CoreDims *)0x1;
      do {
        pCVar13 = pCVar18;
        if (pCVar5 == pCVar13) break;
        pCVar18 = (CoreDims *)((long)&pCVar13->DimCount + 1);
      } while (psVar7[(long)pCVar13] <= psVar25[(long)pCVar13]);
      local_1398 = pCVar5;
      if (pCVar13 < pCVar5) {
        return 1;
      }
    }
    sVar11 = (size_t)typeSize;
    inStride.Dimensions[uVar15 - 1] = sVar11;
    if ((1 < inStride.super_CoreDims.DimCount) &&
       (inStride.Dimensions[inStride.super_CoreDims.DimCount - 2] =
             inMemCountNC.Dimensions[inStride.super_CoreDims.DimCount - 1] * sVar11,
       2 < inStride.super_CoreDims.DimCount)) {
      sVar10 = inStride.Dimensions[inStride.super_CoreDims.DimCount - 2];
      sVar27 = inStride.super_CoreDims.DimCount;
      do {
        sVar10 = sVar10 * inMemCountNC.Dimensions[sVar27 - 2];
        inStride.Dimensions[sVar27 - 3] = sVar10;
        sVar27 = sVar27 - 1;
      } while (sVar27 != 2);
    }
    psVar20 = outMemCountNC.super_CoreDims.DimensSpan;
    outStride.Dimensions[uVar15 - 1] = sVar11;
    if ((1 < outStride.super_CoreDims.DimCount) &&
       (outStride.Dimensions[outStride.super_CoreDims.DimCount - 2] =
             sVar11 * psVar20[outStride.super_CoreDims.DimCount - 1],
       2 < outStride.super_CoreDims.DimCount)) {
      sVar11 = outStride.Dimensions[outStride.super_CoreDims.DimCount - 2];
      sVar10 = outStride.super_CoreDims.DimCount;
      do {
        sVar11 = sVar11 * psVar20[sVar10 - 2];
        outStride.Dimensions[sVar10 - 3] = sVar11;
        sVar10 = sVar10 - 1;
      } while (sVar10 != 2);
    }
    ppsVar8 = (size_t **)(outStride.Dimensions + (outStride.super_CoreDims.DimCount - 1));
    if (outStride.Dimensions < ppsVar8 && outStride.super_CoreDims.DimCount != 0) {
      psVar20 = outStride.Dimensions;
      do {
        psVar20 = psVar20 + 1;
        sVar11 = psVar20[-1];
        psVar20[-1] = (size_t)*ppsVar8;
        *ppsVar8 = (size_t *)sVar11;
        ppsVar8 = ppsVar8 + -1;
      } while (psVar20 < ppsVar8);
    }
    if (local_1360 != 0) {
      uVar15 = 0;
      do {
        inRltvOvlpStartPos.Dimensions[uVar15] = psVar7[uVar15] - inMemStartNC.Dimensions[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar15 < local_1360);
    }
    psVar20 = revOvlpStart.Dimensions;
    sVar26 = 0;
    local_1390 = (CoreDims *)psVar7;
    revOvlpStart.super_CoreDims.DimCount = (size_t)local_1398;
    revOvlpStart.super_CoreDims.DimensSpan = psVar20;
    memset(psVar20,0,0x100);
    pCVar18 = local_1398;
    if (pCVar5 != (CoreDims *)0x0) {
      sVar26 = (long)local_1398 * 8;
      memmove(psVar20,local_1390,sVar26);
    }
    psVar7 = (size_t *)((long)revOvlpStart.Dimensions + (sVar26 - 8));
    if (psVar20 < psVar7 && pCVar18 != (CoreDims *)0x0) {
      psVar12 = revOvlpStart.Dimensions;
      do {
        psVar12 = psVar12 + 1;
        sVar11 = psVar12[-1];
        psVar12[-1] = *psVar7;
        *psVar7 = sVar11;
        psVar7 = psVar7 + -1;
        psVar20 = revOvlpStart.super_CoreDims.DimensSpan;
      } while (psVar12 < psVar7);
    }
    sVar11 = outMemStartNC.super_CoreDims.DimCount;
    uVar15 = uVar6;
    if (outMemStartNC.super_CoreDims.DimCount != 0) {
      uVar6 = 0;
      do {
        outRltvOvlpStartPos.Dimensions[uVar6] = psVar20[uVar6] - outMemStartNC.Dimensions[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar6 < sVar11);
    }
    goto LAB_003f8a54;
  }
  psVar12 = local_1390->DimensSpan;
  if (uVar15 != 0) {
    psVar25 = local_1398->DimensSpan;
    uVar6 = 0;
    do {
      inEnd.Dimensions[uVar6] = (psVar25[uVar6] + psVar12[uVar6]) - 1;
      uVar6 = uVar6 + 1;
    } while (uVar15 != uVar6);
  }
  psVar25 = outCount->DimensSpan;
  sVar10 = outStart->DimCount;
  psVar22 = outStart->DimensSpan;
  if (sVar10 != 0) {
    sVar27 = 0;
    do {
      outEnd.Dimensions[sVar27] = (psVar22[sVar27] + psVar25[sVar27]) - 1;
      sVar27 = sVar27 + 1;
    } while (sVar10 != sVar27);
  }
  if (uVar15 == 0) {
    sVar11 = 0;
LAB_003f8217:
    uVar6 = 0;
    psVar24 = psVar20;
  }
  else {
    psVar1 = local_1398->DimensSpan;
    uVar6 = 0;
    do {
      uVar19 = psVar22[uVar6];
      if (uVar19 < psVar1[uVar6]) {
        uVar19 = psVar1[uVar6];
      }
      ovlpStart.Dimensions[uVar6] = uVar19;
      psVar4 = inEnd.super_CoreDims.DimensSpan;
      psVar3 = outEnd.super_CoreDims.DimensSpan;
      psVar24 = ovlpEnd.super_CoreDims.DimensSpan;
      uVar6 = uVar6 + 1;
    } while (uVar6 < ovlpStart.super_CoreDims.DimCount);
    if (uVar15 == 0) goto LAB_003f8217;
    uVar6 = 0;
    do {
      uVar19 = psVar3[uVar6];
      if (psVar4[uVar6] < psVar3[uVar6]) {
        uVar19 = psVar4[uVar6];
      }
      ovlpEnd.Dimensions[uVar6] = uVar19;
      uVar6 = uVar6 + 1;
    } while (uVar6 < ovlpEnd.super_CoreDims.DimCount);
    psVar20 = ovlpEnd.super_CoreDims.DimensSpan;
    if (uVar15 == 0) goto LAB_003f8217;
    uVar19 = 0;
    do {
      ovlpCount.Dimensions[uVar19] = (psVar24[uVar19] - psVar7[uVar19]) + 1;
      uVar19 = uVar19 + 1;
      uVar6 = ovlpCount.super_CoreDims.DimCount;
    } while (uVar19 < ovlpCount.super_CoreDims.DimCount);
  }
  if (sVar11 != 0) {
    if (*psVar24 < *psVar7) {
      return 1;
    }
    uVar19 = 1;
    do {
      uVar23 = uVar19;
      if (sVar11 == uVar23) break;
      uVar19 = uVar23 + 1;
    } while (psVar7[uVar23] <= psVar24[uVar23]);
    if (uVar23 < sVar11) {
      return 1;
    }
  }
  sVar11 = (size_t)typeSize;
  inStride.Dimensions[uVar15 - 1] = sVar11;
  if ((1 < inStride.super_CoreDims.DimCount) &&
     (inStride.Dimensions[inStride.super_CoreDims.DimCount - 2] =
           psVar12[inStride.super_CoreDims.DimCount - 1] * sVar11,
     2 < inStride.super_CoreDims.DimCount)) {
    sVar10 = inStride.Dimensions[inStride.super_CoreDims.DimCount - 2];
    sVar27 = inStride.super_CoreDims.DimCount;
    do {
      sVar10 = sVar10 * psVar12[sVar27 - 2];
      inStride.Dimensions[sVar27 - 3] = sVar10;
      sVar27 = sVar27 - 1;
    } while (sVar27 != 2);
  }
  outStride.Dimensions[uVar15 - 1] = sVar11;
  if ((1 < outStride.super_CoreDims.DimCount) &&
     (outStride.Dimensions[outStride.super_CoreDims.DimCount - 2] =
           sVar11 * psVar25[outStride.super_CoreDims.DimCount - 1],
     2 < outStride.super_CoreDims.DimCount)) {
    sVar11 = outStride.Dimensions[outStride.super_CoreDims.DimCount - 2];
    sVar10 = outStride.super_CoreDims.DimCount;
    do {
      sVar11 = sVar11 * psVar25[sVar10 - 2];
      outStride.Dimensions[sVar10 - 3] = sVar11;
      sVar10 = sVar10 - 1;
    } while (sVar10 != 2);
  }
  if (local_1360 != 0) {
    uVar15 = 0;
    do {
      inRltvOvlpStartPos.Dimensions[uVar15] = psVar7[uVar15] - inMemStartNC.Dimensions[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar15 < local_1360);
  }
  uVar15 = uVar6;
  if (local_1388 != 0) {
    uVar6 = 0;
    do {
      outRltvOvlpStartPos.Dimensions[uVar6] = psVar7[uVar6] - outMemStartNC.Dimensions[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_1388);
  }
LAB_003f8a54:
  sVar26 = (size_t)typeSize;
  if ((bool)(char)local_1364 == outIsLittleEndian) {
    if (!safeMode) {
      local_1378 = out;
      local_1370 = in;
      NdCopyRecurDFNonSeqDynamic
                (0,in,out,&inRltvOvlpStartPos.super_CoreDims,&outRltvOvlpStartPos.super_CoreDims,
                 &inStride.super_CoreDims,&outStride.super_CoreDims,&ovlpCount.super_CoreDims,sVar26
                );
      return 0;
    }
    revInStart.super_CoreDims.DimCount = uVar15 + 1;
    psVar20 = revInStart.Dimensions;
    local_1378 = out;
    local_1370 = in;
    revInStart.super_CoreDims.DimensSpan = psVar20;
    memset(psVar20,0,0x100);
    if (uVar15 + 1 != 0) {
      memset(psVar20,0,uVar15 * 8 + 8);
    }
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&blockSize,uVar15 + 1,
               (allocator_type *)&revOvlpStart);
    *(char **)blockSize = in;
    std::vector<char_*,_std::allocator<char_*>_>::vector
              ((vector<char_*,_std::allocator<char_*>_> *)&revOvlpStart,
               ovlpCount.super_CoreDims.DimCount + 1,&local_1399);
    *(char **)revOvlpStart.super_CoreDims.DimCount = out;
    sVar11 = 0;
    do {
      for (; sVar11 != inStride.super_CoreDims.DimCount; sVar11 = sVar11 + 1) {
        *(size_t *)(blockSize + 8 + sVar11 * 8) =
             (revInStart.super_CoreDims.DimensSpan[sVar11] +
             inRltvOvlpStartPos.super_CoreDims.DimensSpan[sVar11]) *
             inStride.super_CoreDims.DimensSpan[sVar11] + *(long *)(blockSize + sVar11 * 8);
        *(size_t *)(revOvlpStart.super_CoreDims.DimCount + 8 + sVar11 * 8) =
             (revInStart.super_CoreDims.DimensSpan[sVar11] +
             outRltvOvlpStartPos.super_CoreDims.DimensSpan[sVar11]) *
             outStride.super_CoreDims.DimensSpan[sVar11] +
             *(long *)(revOvlpStart.super_CoreDims.DimCount + sVar11 * 8);
        revInStart.super_CoreDims.DimensSpan[sVar11] =
             revInStart.super_CoreDims.DimensSpan[sVar11] + 1;
      }
      memcpy(*(void **)(revOvlpStart.super_CoreDims.DimCount + sVar11 * 8),
             *(void **)(blockSize + sVar11 * 8),sVar26);
      sVar10 = sVar11;
      do {
        sVar11 = sVar10 - 1;
        if (sVar10 == 0) {
          if (revOvlpStart.super_CoreDims.DimCount != 0) {
            operator_delete((void *)revOvlpStart.super_CoreDims.DimCount);
          }
          goto joined_r0x003f8e53;
        }
        revInStart.super_CoreDims.DimensSpan[sVar10] = 0;
        sVar10 = sVar11;
      } while (revInStart.super_CoreDims.DimensSpan[sVar11] ==
               ovlpCount.super_CoreDims.DimensSpan[sVar11]);
    } while( true );
  }
  if (!safeMode) {
    local_1378 = out;
    local_1370 = in;
    NdCopyRecurDFNonSeqDynamicRevEndian
              (0,in,out,&inRltvOvlpStartPos.super_CoreDims,&outRltvOvlpStartPos.super_CoreDims,
               &inStride.super_CoreDims,&outStride.super_CoreDims,&ovlpCount.super_CoreDims,sVar26);
    return 0;
  }
  revInStart.super_CoreDims.DimCount = uVar15 + 1;
  psVar20 = revInStart.Dimensions;
  local_1378 = out;
  local_1370 = in;
  revInStart.super_CoreDims.DimensSpan = psVar20;
  memset(psVar20,0,0x100);
  if (uVar15 + 1 != 0) {
    memset(psVar20,0,uVar15 * 8 + 8);
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&blockSize,uVar15 + 1,
             (allocator_type *)&revOvlpStart);
  *(char **)blockSize = in;
  std::vector<char_*,_std::allocator<char_*>_>::vector
            ((vector<char_*,_std::allocator<char_*>_> *)&revOvlpStart,
             ovlpCount.super_CoreDims.DimCount + 1,&local_1399);
  *(char **)revOvlpStart.super_CoreDims.DimCount = out;
  sVar11 = 0;
  do {
    for (; sVar11 != inStride.super_CoreDims.DimCount; sVar11 = sVar11 + 1) {
      *(size_t *)(blockSize + 8 + sVar11 * 8) =
           (revInStart.super_CoreDims.DimensSpan[sVar11] +
           inRltvOvlpStartPos.super_CoreDims.DimensSpan[sVar11]) *
           inStride.super_CoreDims.DimensSpan[sVar11] + *(long *)(blockSize + sVar11 * 8);
      *(size_t *)(revOvlpStart.super_CoreDims.DimCount + 8 + sVar11 * 8) =
           (revInStart.super_CoreDims.DimensSpan[sVar11] +
           outRltvOvlpStartPos.super_CoreDims.DimensSpan[sVar11]) *
           outStride.super_CoreDims.DimensSpan[sVar11] +
           *(long *)(revOvlpStart.super_CoreDims.DimCount + sVar11 * 8);
      revInStart.super_CoreDims.DimensSpan[sVar11] =
           revInStart.super_CoreDims.DimensSpan[sVar11] + 1;
    }
    if (typeSize != 0) {
      lVar17 = 0;
      sVar9 = sVar26;
      do {
        *(undefined1 *)(*(long *)(revOvlpStart.super_CoreDims.DimCount + sVar11 * 8) + lVar17) =
             *(undefined1 *)(*(long *)(blockSize + sVar11 * 8) + -1 + sVar9);
        lVar17 = lVar17 + 1;
        sVar9 = sVar9 - 1;
      } while (sVar9 != 0);
    }
    do {
      sVar10 = sVar11 - 1;
      if (sVar11 == 0) {
        if (revOvlpStart.super_CoreDims.DimCount != 0) {
          operator_delete((void *)revOvlpStart.super_CoreDims.DimCount);
        }
joined_r0x003f8e53:
        if ((void *)blockSize != (void *)0x0) {
          operator_delete((void *)blockSize);
        }
        return 0;
      }
      revInStart.super_CoreDims.DimensSpan[sVar11] = 0;
      sVar11 = sVar10;
    } while (revInStart.super_CoreDims.DimensSpan[sVar10] ==
             ovlpCount.super_CoreDims.DimensSpan[sVar10]);
  } while( true );
}

Assistant:

int NdCopy(const char *in, const CoreDims &inStart, const CoreDims &inCount,
           const bool inIsRowMajor, const bool inIsLittleEndian, char *out,
           const CoreDims &outStart, const CoreDims &outCount, const bool outIsRowMajor,
           const bool outIsLittleEndian, const int typeSize, const CoreDims &inMemStart,
           const CoreDims &inMemCount, const CoreDims &outMemStart, const CoreDims &outMemCount,
           const bool safeMode, const MemorySpace MemSpace, const bool duringWrite)

{

    // use values of ioStart and ioCount if ioMemStart and ioMemCount are
    // left as default
    DimsArray inMemStartNC = inMemStart.empty() ? inStart : inMemStart;
    DimsArray inMemCountNC = inMemCount.empty() ? inCount : inMemCount;
    DimsArray outMemStartNC = outMemStart.empty() ? outStart : outMemStart;
    DimsArray outMemCountNC = outMemCount.empty() ? outCount : outMemCount;

    DimsArray inEnd(inStart.size());
    DimsArray outEnd(inStart.size());
    DimsArray ovlpStart(inStart.size());
    DimsArray ovlpEnd(inStart.size());
    DimsArray ovlpCount(inStart.size());
    DimsArray inStride(inStart.size());
    DimsArray outStride(inStart.size());
    DimsArray inOvlpGapSize(inStart.size());
    DimsArray outOvlpGapSize(inStart.size());
    DimsArray inRltvOvlpStartPos(inStart.size());
    DimsArray outRltvOvlpStartPos(inStart.size());
    size_t minContDim, blockSize;
    const char *inOvlpBase = nullptr;
    char *outOvlpBase = nullptr;
    auto GetInEnd = [](CoreDims &inEnd, const CoreDims &inStart, const CoreDims &inCount) {
        for (size_t i = 0; i < inStart.size(); i++)
        {
            inEnd[i] = inStart[i] + inCount[i] - 1;
        }
    };
    auto GetOutEnd = [](CoreDims &outEnd, const CoreDims &outStart, const CoreDims &output_count) {
        for (size_t i = 0; i < outStart.size(); i++)
        {
            outEnd[i] = outStart[i] + output_count[i] - 1;
        }
    };
    auto GetOvlpStart = [](CoreDims &ovlpStart, const CoreDims &inStart, const CoreDims &outStart) {
        for (size_t i = 0; i < ovlpStart.size(); i++)
        {
            ovlpStart[i] = inStart[i] > outStart[i] ? inStart[i] : outStart[i];
        }
    };
    auto GetOvlpEnd = [](CoreDims &ovlpEnd, CoreDims &inEnd, CoreDims &outEnd) {
        for (size_t i = 0; i < ovlpEnd.size(); i++)
        {
            ovlpEnd[i] = inEnd[i] < outEnd[i] ? inEnd[i] : outEnd[i];
        }
    };
    auto GetOvlpCount = [](CoreDims &ovlpCount, CoreDims &ovlpStart, CoreDims &ovlpEnd) {
        for (size_t i = 0; i < ovlpCount.size(); i++)
        {
            ovlpCount[i] = ovlpEnd[i] - ovlpStart[i] + 1;
        }
    };
    auto HasOvlp = [](CoreDims &ovlpStart, CoreDims &ovlpEnd) {
        for (size_t i = 0; i < ovlpStart.size(); i++)
        {
            if (ovlpEnd[i] < ovlpStart[i])
            {
                return false;
            }
        }
        return true;
    };

    auto GetIoStrides = [](CoreDims &ioStride, const CoreDims &ioCount, size_t elmSize) {
        // ioStride[i] holds the total number of elements under each element
        // of the i'th dimension
        ioStride[ioStride.size() - 1] = elmSize;
        if (ioStride.size() > 1)
        {
            ioStride[ioStride.size() - 2] = ioCount[ioStride.size() - 1] * elmSize;
        }
        if (ioStride.size() > 2)
        {
            size_t i = ioStride.size() - 3;
            while (true)
            {
                ioStride[i] = ioCount[i + 1] * ioStride[i + 1];
                if (i == 0)
                {
                    break;
                }
                else
                {
                    i--;
                }
            }
        }
    };

    auto GetInOvlpBase = [](const char *&inOvlpBase, const char *in, const CoreDims &inStart,
                            CoreDims &inStride, CoreDims &ovlpStart) {
        inOvlpBase = in;
        for (size_t i = 0; i < inStart.size(); i++)
        {
            inOvlpBase = inOvlpBase + (ovlpStart[i] - inStart[i]) * inStride[i];
        }
    };
    auto GetOutOvlpBase = [](char *&outOvlpBase, char *out, const CoreDims &outStart,
                             CoreDims &outStride, CoreDims &ovlpStart) {
        outOvlpBase = out;
        for (size_t i = 0; i < outStart.size(); i++)
        {
            outOvlpBase = outOvlpBase + (ovlpStart[i] - outStart[i]) * outStride[i];
        }
    };
    auto GetIoOvlpGapSize = [](CoreDims &ioOvlpGapSize, CoreDims &ioStride, const CoreDims &ioCount,
                               CoreDims &ovlpCount) {
        for (size_t i = 0; i < ioOvlpGapSize.size(); i++)
        {
            ioOvlpGapSize[i] = (ioCount[i] - ovlpCount[i]) * ioStride[i];
        }
    };
    auto GetMinContDim = [](const CoreDims &inCount, const CoreDims &outCount,
                            CoreDims &ovlpCount) {
        //    note: minContDim is the first index where its input box and
        //    overlap box
        //    are not fully match. therefore all data below this branch is
        //    contingous
        //    and this determins the Biggest continuous block size - Each
        //    element of the
        //    current dimension.
        size_t i = ovlpCount.size() - 1;
        while (true)
        {
            if (i == 0)
            {
                break;
            }
            if ((inCount[i] != ovlpCount[i]) || (outCount[i] != ovlpCount[i]))
            {
                break;
            }
            i--;
        }
        return i;
    };
    auto GetBlockSize = [](CoreDims &ovlpCount, size_t minContDim, size_t elmSize) {
        size_t res = elmSize;
        for (size_t i = minContDim; i < ovlpCount.size(); i++)
        {
            res *= ovlpCount[i];
        }
        return res;
    };

    auto GetRltvOvlpStartPos = [](CoreDims &ioRltvOvlpStart, const CoreDims &ioStart,
                                  CoreDims &ovlpStart) {
        for (size_t i = 0; i < ioStart.size(); i++)
        {
            ioRltvOvlpStart[i] = ovlpStart[i] - ioStart[i];
        }
    };

    // main flow
    // row-major ==> row-major mode
    // algrithm optimizations:
    // 1. contigous data copying
    // 2. mem pointer arithmetics by sequential padding. O(1) overhead/block
    if (inIsRowMajor && outIsRowMajor)
    {
        GetInEnd(inEnd, inStart, inCount);
        GetOutEnd(outEnd, outStart, outCount);
        GetOvlpStart(ovlpStart, inStart, outStart);
        GetOvlpEnd(ovlpEnd, inEnd, outEnd);
        GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
        if (!HasOvlp(ovlpStart, ovlpEnd))
        {
            return 1; // no overlap found
        }
        GetIoStrides(inStride, inMemCountNC, typeSize);
        GetIoStrides(outStride, outMemCountNC, typeSize);
        GetIoOvlpGapSize(inOvlpGapSize, inStride, inMemCountNC, ovlpCount);
        GetIoOvlpGapSize(outOvlpGapSize, outStride, outMemCountNC, ovlpCount);
        GetInOvlpBase(inOvlpBase, in, inMemStartNC, inStride, ovlpStart);
        GetOutOvlpBase(outOvlpBase, out, outMemStartNC, outStride, ovlpStart);
        minContDim = GetMinContDim(inMemCountNC, outMemCountNC, ovlpCount);
        blockSize = GetBlockSize(ovlpCount, minContDim, typeSize);
        // same endianess mode: most optimized, contiguous data copying
        // algorithm used.
        if (inIsLittleEndian == outIsLittleEndian)
        {
#ifdef ADIOS2_HAVE_GPU_SUPPORT
            if (MemSpace == MemorySpace::GPU)
            {
                helper::NdCopyGPU(inOvlpBase, outOvlpBase, inOvlpGapSize, outOvlpGapSize, ovlpCount,
                                  minContDim, blockSize, MemSpace, duringWrite);
                return 0;
            }
#endif
            // most efficient algm
            // warning: number of function stacks used is number of dimensions
            // of data.
            if (!safeMode)
            {
                NdCopyRecurDFSeqPadding(0, inOvlpBase, outOvlpBase, inOvlpGapSize, outOvlpGapSize,
                                        ovlpCount, minContDim, blockSize);
            }
            else // safeMode
            {
                //      //alternative iterative version, 10% slower then
                //      recursive
                //      //use it when very high demension is used.
                NdCopyIterDFSeqPadding(inOvlpBase, outOvlpBase, inOvlpGapSize, outOvlpGapSize,
                                       ovlpCount, minContDim, blockSize);
            }
        }
        // different endianess mode
        else
        {
#ifdef ADIOS2_HAVE_GPU_SUPPORT
            if (MemSpace == MemorySpace::GPU)
            {
                helper::Throw<std::invalid_argument>(
                    "Helper", "Memory", "CopyContiguousMemory",
                    "Direct byte order reversal not supported for GPU buffers");
            }
#endif
            if (!safeMode)
            {
                NdCopyRecurDFSeqPaddingRevEndian(0, inOvlpBase, outOvlpBase, inOvlpGapSize,
                                                 outOvlpGapSize, ovlpCount, minContDim, blockSize,
                                                 typeSize, blockSize / typeSize);
            }
            else
            {
                NdCopyIterDFSeqPaddingRevEndian(inOvlpBase, outOvlpBase, inOvlpGapSize,
                                                outOvlpGapSize, ovlpCount, minContDim, blockSize,
                                                typeSize, blockSize / typeSize);
            }
        }
    }

    // Copying modes involing col-major
    // algorithm optimization:
    // 1. mem ptr arithmetics: O(1) overhead per block, dynamic/non-sequential
    // padding
    else
    {
#ifdef ADIOS2_HAVE_GPU_SUPPORT
        if (MemSpace == MemorySpace::GPU)
        {
            helper::Throw<std::invalid_argument>(
                "Helper", "Memory", "CopyContiguousMemory",
                "Direct byte order reversal not supported for GPU buffers");
        }
#endif
        //        CoreDims revInCount(inCount);
        //        CoreDims revOutCount(outCount);
        //
        // col-major ==> col-major mode
        if (!inIsRowMajor && !outIsRowMajor)
        {

            GetInEnd(inEnd, inStart, inCount);
            GetOutEnd(outEnd, outStart, outCount);
            GetOvlpStart(ovlpStart, inStart, outStart);
            GetOvlpEnd(ovlpEnd, inEnd, outEnd);
            GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
            if (!HasOvlp(ovlpStart, ovlpEnd))
            {
                return 1; // no overlap found
            }

            GetIoStrides(inStride, inCount, typeSize);
            GetIoStrides(outStride, outCount, typeSize);

            GetRltvOvlpStartPos(inRltvOvlpStartPos, inMemStartNC, ovlpStart);
            GetRltvOvlpStartPos(outRltvOvlpStartPos, outMemStartNC, ovlpStart);
        }
        // row-major ==> col-major mode
        else if (inIsRowMajor && !outIsRowMajor)
        {
            DimsArray revOutStart(outStart);
            DimsArray revOutCount(outCount);

            std::reverse(outMemStartNC.begin(), outMemStartNC.end());
            std::reverse(outMemCountNC.begin(), outMemCountNC.end());

            GetInEnd(inEnd, inStart, inCount);
            GetOutEnd(outEnd, revOutStart, revOutCount);
            GetOvlpStart(ovlpStart, inStart, revOutStart);
            GetOvlpEnd(ovlpEnd, inEnd, outEnd);
            GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
            if (!HasOvlp(ovlpStart, ovlpEnd))
            {
                return 1; // no overlap found
            }

            // get normal order inStride
            GetIoStrides(inStride, inMemCountNC, typeSize);

            // calulate reversed order outStride
            GetIoStrides(outStride, outMemCountNC, typeSize);
            // reverse outStride so that outStride aligns to inStride
            std::reverse(outStride.begin(), outStride.end());

            // get normal order inOvlpStart
            GetRltvOvlpStartPos(inRltvOvlpStartPos, inMemStartNC, ovlpStart);

            // get reversed order outOvlpStart
            DimsArray revOvlpStart(ovlpStart);
            std::reverse(revOvlpStart.begin(), revOvlpStart.end());
            GetRltvOvlpStartPos(outRltvOvlpStartPos, outMemStartNC, revOvlpStart);
        }
        // col-major ==> row-major mode
        else if (!inIsRowMajor && outIsRowMajor)
        {
            DimsArray revInStart(inStart);
            DimsArray revInCount(inCount);
            std::reverse(inMemStartNC.begin(), inMemStartNC.end());
            std::reverse(inMemCountNC.begin(), inMemCountNC.end());

            GetInEnd(inEnd, revInStart, revInCount);
            GetOutEnd(outEnd, outStart, outCount);
            GetOvlpStart(ovlpStart, revInStart, outStart);
            GetOvlpEnd(ovlpEnd, inEnd, outEnd);
            GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
            if (!HasOvlp(ovlpStart, ovlpEnd))
            {
                return 1; // no overlap found
            }

            // get normal order outStride
            GetIoStrides(outStride, outMemCountNC, typeSize);

            // calculate reversed inStride
            GetIoStrides(inStride, inMemCountNC, typeSize);
            // reverse inStride so that inStride aligns to outStride
            std::reverse(inStride.begin(), inStride.end());

            // get reversed order inOvlpStart
            DimsArray revOvlpStart(ovlpStart);
            std::reverse(revOvlpStart.begin(), revOvlpStart.end());
            GetRltvOvlpStartPos(inRltvOvlpStartPos, inMemStartNC, revOvlpStart);
            // get normal order outOvlpStart
            GetRltvOvlpStartPos(outRltvOvlpStartPos, outMemStartNC, ovlpStart);
        }

        inOvlpBase = in;
        outOvlpBase = out;
        // Same Endian"
        if (inIsLittleEndian == outIsLittleEndian)
        {
            if (!safeMode)
            {
                NdCopyRecurDFNonSeqDynamic(0, inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                           outRltvOvlpStartPos, inStride, outStride, ovlpCount,
                                           typeSize);
            }
            else
            {
                NdCopyIterDFDynamic(inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                    outRltvOvlpStartPos, inStride, outStride, ovlpCount, typeSize);
            }
        }
        // different Endian"
        else
        {
            if (!safeMode)
            {
                NdCopyRecurDFNonSeqDynamicRevEndian(0, inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                                    outRltvOvlpStartPos, inStride, outStride,
                                                    ovlpCount, typeSize);
            }
            else
            {
                NdCopyIterDFDynamicRevEndian(inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                             outRltvOvlpStartPos, inStride, outStride, ovlpCount,
                                             typeSize);
            }
        }
    }
    return 0;
}